

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Model::Model(Model *this,uint64_t id,Element *element,Document *doc,string *name)

{
  Scope *this_00;
  Element *el;
  Element *el_00;
  Token *pTVar1;
  Token *t;
  allocator local_71;
  string local_70;
  string *local_50;
  string *local_48;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Model_00245da0;
  local_48 = (string *)&this->shading;
  (this->materials).
  super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials).
  super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials).
  super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->geometry).
  super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->geometry).
  super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->geometry).
  super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->attributes).
  super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).
  super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributes).
  super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string(local_48,"Y",(allocator *)&local_70);
  (this->culling)._M_dataplus._M_p = (pointer)&(this->culling).field_2;
  (this->culling)._M_string_length = 0;
  local_50 = (string *)&this->culling;
  (this->culling).field_2._M_local_buf[0] = '\0';
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = GetRequiredScope(element);
  std::__cxx11::string::string((string *)&local_70,"Shading",(allocator *)&local_40);
  el = Scope::operator[](this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"Culling",(allocator *)&local_40);
  el_00 = Scope::operator[](this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (el != (Element *)0x0) {
    pTVar1 = GetRequiredToken(el,0);
    Token::StringContents_abi_cxx11_(&local_70,pTVar1);
    std::__cxx11::string::operator=(local_48,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (el_00 != (Element *)0x0) {
    pTVar1 = GetRequiredToken(el_00,0);
    ParseTokenAsString_abi_cxx11_(&local_70,(FBX *)pTVar1,t);
    std::__cxx11::string::operator=(local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string((string *)&local_70,"Model.FbxNode",&local_71);
  Util::GetPropertyTable((Util *)&local_40,doc,&local_70,element,this_00,false);
  std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->props).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>,
             &local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__cxx11::string::~string((string *)&local_70);
  ResolveLinks(this,element,doc);
  return;
}

Assistant:

Model::Model(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : Object(id,element,name)
    , shading("Y")
{
    const Scope& sc = GetRequiredScope(element);
    const Element* const Shading = sc["Shading"];
    const Element* const Culling = sc["Culling"];

    if(Shading) {
        shading = GetRequiredToken(*Shading,0).StringContents();
    }

    if (Culling) {
        culling = ParseTokenAsString(GetRequiredToken(*Culling,0));
    }

    props = GetPropertyTable(doc,"Model.FbxNode",element,sc);
    ResolveLinks(element,doc);
}